

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O0

bool __thiscall
Rml::PropertySpecification::ParsePropertyDeclaration
          (PropertySpecification *this,PropertyDictionary *dictionary,String *property_name,
          String *property_value)

{
  PropertyId property_id_00;
  ShorthandId shorthand_id_00;
  IdNameMap<Rml::PropertyId> *this_00;
  IdNameMap<Rml::ShorthandId> *this_01;
  ShorthandId shorthand_id;
  PropertyId property_id;
  String *property_value_local;
  String *property_name_local;
  PropertyDictionary *dictionary_local;
  PropertySpecification *this_local;
  
  this_00 = &::std::unique_ptr<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
             ::operator->(&this->property_map)->super_IdNameMap<Rml::PropertyId>;
  property_id_00 = IdNameMap<Rml::PropertyId>::GetId(this_00,property_name);
  if (property_id_00 == Invalid) {
    this_01 = &::std::
               unique_ptr<Rml::ShorthandIdNameMap,_std::default_delete<Rml::ShorthandIdNameMap>_>::
               operator->(&this->shorthand_map)->super_IdNameMap<Rml::ShorthandId>;
    shorthand_id_00 = IdNameMap<Rml::ShorthandId>::GetId(this_01,property_name);
    if (shorthand_id_00 == Invalid) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = ParseShorthandDeclaration(this,dictionary,shorthand_id_00,property_value);
    }
  }
  else {
    this_local._7_1_ = ParsePropertyDeclaration(this,dictionary,property_id_00,property_value);
  }
  return this_local._7_1_;
}

Assistant:

bool PropertySpecification::ParsePropertyDeclaration(PropertyDictionary& dictionary, const String& property_name, const String& property_value) const
{
	RMLUI_ZoneScoped;

	// Try as a property first
	PropertyId property_id = property_map->GetId(property_name);
	if (property_id != PropertyId::Invalid)
		return ParsePropertyDeclaration(dictionary, property_id, property_value);

	// Then, as a shorthand
	ShorthandId shorthand_id = shorthand_map->GetId(property_name);
	if (shorthand_id != ShorthandId::Invalid)
		return ParseShorthandDeclaration(dictionary, shorthand_id, property_value);

	return false;
}